

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::PlaTask::checkArguments
          (PlaTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Scope *pSVar1;
  Compilation *pCVar2;
  Type *this_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Type *this_01;
  ConstantRange CVar6;
  long lVar7;
  char *func;
  Expression *arg;
  ulong uVar8;
  Type *local_50;
  
  pSVar1 = (context->scope).ptr;
  if (pSVar1 == (Scope *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
LAB_0038374a:
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,func);
  }
  pCVar2 = pSVar1->compilation;
  bVar3 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,3,3);
  lVar7 = 0x140;
  if (bVar3) {
    bVar3 = args->size_ != 0;
    if (bVar3) {
      uVar8 = 0;
      do {
        this_00 = (args->data_[uVar8]->type).ptr;
        if (this_00 == (Type *)0x0) {
          func = 
          "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
          goto LAB_0038374a;
        }
        if (uVar8 == 0) {
          bVar4 = Type::isUnpackedArray(this_00);
          if (!bVar4) {
            if (args->size_ == 0) goto LAB_00383754;
            arg = *args->data_;
            goto LAB_00383692;
          }
          this_01 = Type::getArrayElementType(this_00);
          bVar4 = Type::isSimpleBitVector(this_01);
          if (bVar4) {
            if (this_01->canonical == (Type *)0x0) {
              Type::resolveCanonical(this_01);
            }
            if ((this_01->canonical->super_Symbol).kind == PredefinedIntegerType) goto LAB_00383614;
            bVar5 = Type::hasFixedRange(this_01);
            bVar4 = true;
            if ((bVar5) && (CVar6 = Type::getFixedRange(this_01), CVar6.right < CVar6.left)) {
              if (args->size_ == 0) goto LAB_00383754;
              local_50 = badRange(context,*args->data_);
              goto LAB_00383632;
            }
          }
          else {
LAB_00383614:
            if (args->size_ == 0) goto LAB_00383754;
            local_50 = SystemSubroutine::badArg((SystemSubroutine *)this,context,*args->data_);
LAB_00383632:
            bVar4 = false;
          }
          if (bVar4) goto LAB_00383644;
          bVar4 = false;
        }
        else {
          bVar4 = Type::isSimpleBitVector(this_00);
          if (bVar4) {
            if (this_00->canonical == (Type *)0x0) {
              Type::resolveCanonical(this_00);
            }
            if ((this_00->canonical->super_Symbol).kind == PredefinedIntegerType) goto LAB_003835be;
LAB_00383644:
            bVar5 = Type::hasFixedRange(this_00);
            bVar4 = true;
            if ((!bVar5) || (CVar6 = Type::getFixedRange(this_00), CVar6.left <= CVar6.right))
            goto LAB_003836a6;
            if (args->size_ <= uVar8) goto LAB_00383754;
            local_50 = badRange(context,args->data_[uVar8]);
          }
          else {
LAB_003835be:
            if (args->size_ <= uVar8) {
LAB_00383754:
              std::terminate();
            }
            arg = args->data_[uVar8];
LAB_00383692:
            local_50 = SystemSubroutine::badArg((SystemSubroutine *)this,context,arg);
          }
          bVar4 = false;
        }
LAB_003836a6:
        if (!bVar4) break;
        uVar8 = uVar8 + 1;
        bVar3 = uVar8 < args->size_;
      } while (bVar3);
    }
    lVar7 = 0x138;
    if (bVar3) {
      return local_50;
    }
  }
  return *(Type **)((long)&(pCVar2->super_BumpAllocator).head + lVar7);
}

Assistant:

SimpleSystemTask(const std::string& name, const Type& returnType, size_t requiredArgs = 0,
                     const std::vector<const Type*>& argTypes = {}) :
        SimpleSystemSubroutine(name, SubroutineKind::Task, requiredArgs, argTypes, returnType,
                               false) {}